

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

bool IsValidSubDEdge(ON_SubDEdge *edge,unsigned_short level,uint *edge_id_range,bool bSilentError)

{
  ON_SubDEdgeTag OVar1;
  uint uVar2;
  bool bVar3;
  long lVar4;
  bool bVar5;
  long *plVar6;
  ON_Internal_DamagedMarker dm;
  ON_Internal_DamagedMarker local_20;
  long local_18;
  long local_10;
  
  if (((edge == (ON_SubDEdge *)0x0) || ((edge->super_ON_SubDComponentBase).m_level != level)) ||
     ((edge_id_range != (uint *)0x0 &&
      ((uVar2 = (edge->super_ON_SubDComponentBase).m_id, uVar2 < *edge_id_range ||
       (edge_id_range[1] < uVar2)))))) {
    ON_SubDIncrementErrorCount();
    if (bSilentError) {
      return false;
    }
    bVar3 = ON_IsNotValid();
    return bVar3;
  }
  lVar4 = 0;
  local_18 = 0;
  local_10 = 0;
  plVar6 = &local_18;
  bVar3 = true;
  do {
    bVar5 = bVar3;
    local_20.m_subd_component = &edge->super_ON_SubDComponentBase;
    if (edge->m_vertex[lVar4] == (ON_SubDVertex *)0x0) {
      ON_SubDIncrementErrorCount();
      if (bSilentError) goto LAB_005ceb32;
      bVar3 = ON_IsNotValid();
      goto LAB_005ceb3d;
    }
    *plVar6 = (long)edge->m_vertex[lVar4];
    lVar4 = 1;
    plVar6 = &local_10;
    bVar3 = false;
  } while (bVar5);
  if (local_18 == local_10) {
    ON_SubDIncrementErrorCount();
    goto LAB_005ceb2e;
  }
  OVar1 = edge->m_edge_tag;
  if (OVar1 == SmoothX) {
LAB_005ceae9:
    if (edge->m_face_count == 2) {
LAB_005ceb1c:
      local_20.m_subd_component = (ON_SubDComponentBase *)0x0;
      bVar3 = true;
      goto LAB_005ceb3d;
    }
    ON_SubDIncrementErrorCount();
  }
  else if (OVar1 == Crease) {
    if ((edge->m_face_count < 3) || (edge->m_facex != (ON_SubDFacePtr *)0x0)) goto LAB_005ceb1c;
    ON_SubDIncrementErrorCount();
  }
  else {
    if (OVar1 == Smooth) goto LAB_005ceae9;
    ON_SubDIncrementErrorCount();
  }
LAB_005ceb2e:
  if (bSilentError) {
LAB_005ceb32:
    bVar3 = false;
  }
  else {
    bVar3 = ON_IsNotValid();
  }
LAB_005ceb3d:
  ON_Internal_DamagedMarker::~ON_Internal_DamagedMarker(&local_20);
  return bVar3;
}

Assistant:

static bool IsValidSubDEdge(
  const ON_SubDEdge* edge,
  unsigned short level,
  unsigned int* edge_id_range,
  bool bSilentError
  )
{
  if (nullptr == edge)
    return ON_SubDIsNotValid(bSilentError);

  if (edge->SubdivisionLevel() != level)
    return ON_SubDIsNotValid(bSilentError);

  if (nullptr != edge_id_range)
  {
    if (edge->m_id < edge_id_range[0])
      return ON_SubDIsNotValid(bSilentError);
    if (edge->m_id > edge_id_range[1])
      return ON_SubDIsNotValid(bSilentError);
  }

  ON_Internal_DamagedMarker dm(edge);

  const ON_SubDVertex* edge_vertex[2] = {};
  for (unsigned int i = 0; i < 2; i++)
  {
    const ON_SubDVertex* vertex = edge->Vertex(i);
    if (nullptr == vertex)
      return ON_SubDIsNotValid(bSilentError);
    edge_vertex[i] = vertex;
  }
  if (edge_vertex[0] == edge_vertex[1])
    return ON_SubDIsNotValid(bSilentError);

  if (edge->IsSmooth())
  {
    // m_edge_tag is ON_SubDEdgeTag::Smooth or ON_SubDEdgeTag::SmoothX
    if ( 2 != edge->m_face_count)
      return ON_SubDIsNotValid(bSilentError);
  }
  else if (ON_SubDEdgeTag::Crease != edge->m_edge_tag)
  {
    return ON_SubDIsNotValid(bSilentError);
  }

  if (edge->m_face_count > 2 && nullptr == edge->m_facex)
    return ON_SubDIsNotValid(bSilentError);

  dm.ClearComponent();

  return true;
}